

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

slab * slab_get_with_order(slab_cache *cache,uint8_t order)

{
  slab *slab_00;
  rlist *prVar1;
  bool bVar2;
  rlist *local_68;
  slab_list *list;
  slab *slab;
  uint8_t order_local;
  slab_cache *cache_local;
  rlist *shift;
  
  if (cache->order_max < order) {
    __assert_fail("order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0xe0,"struct slab *slab_get_with_order(struct slab_cache *, uint8_t)");
  }
  local_68 = &cache->orders[order].slabs;
  while( true ) {
    bVar2 = false;
    if (local_68->next == local_68->prev) {
      bVar2 = local_68->next == local_68;
    }
    if (!bVar2) goto LAB_001043b7;
    if (local_68 == &cache->orders[(int)(uint)cache->order_max].slabs) break;
    local_68 = local_68 + 2;
  }
  slab_00 = (slab *)slab_map(cache->arena);
  if (slab_00 == (slab *)0x0) {
    cache_local = (slab_cache *)0x0;
  }
  else {
    slab_create(slab_00,cache->order_max,(ulong)cache->arena->slab_size);
    slab_poison(slab_00);
    (slab_00->next_in_cache).prev = &(cache->allocated).slabs;
    (slab_00->next_in_cache).next = (cache->allocated).slabs.next;
    ((slab_00->next_in_cache).prev)->next = (rlist *)slab_00;
    ((slab_00->next_in_cache).next)->prev = (rlist *)slab_00;
    (cache->allocated).stats.total = slab_00->size + (cache->allocated).stats.total;
    prVar1 = &slab_00->next_in_list;
    prVar1->prev = local_68;
    (slab_00->next_in_list).next = local_68->next;
    prVar1->prev->next = prVar1;
    ((slab_00->next_in_list).next)->prev = prVar1;
    local_68[1].next = (rlist *)((long)&(local_68[1].next)->prev + slab_00->size);
LAB_001043b7:
    prVar1 = local_68->next;
    local_68->next = prVar1->next;
    prVar1->next->prev = local_68;
    prVar1->prev = prVar1;
    prVar1->next = prVar1;
    list = (slab_list *)(prVar1 + -1);
    if (*(uint8_t *)((long)&prVar1[1].next + 4) != order) {
      local_68[1].next = (rlist *)((long)local_68[1].next - (long)prVar1[1].prev);
      do {
        list = (slab_list *)slab_split(cache,(slab *)list);
      } while (((slab *)list)->order != order);
      cache->orders[((slab *)list)->order].stats.total =
           ((slab *)list)->size + cache->orders[((slab *)list)->order].stats.total;
    }
    slab_set_used(cache,(slab *)list);
    slab_assert(cache,(slab *)list);
    cache_local = (slab_cache *)list;
  }
  return (slab *)cache_local;
}

Assistant:

struct slab *
slab_get_with_order(struct slab_cache *cache, uint8_t order)
{
	assert(order <= cache->order_max);
	struct slab *slab;
	/* Search for the first available slab. If a slab
	 * of a bigger size is found, it can be split.
	 * If cache->order_max is reached and there are no
	 * free slabs, allocate a new one on arena.
	 */
	struct slab_list *list= &cache->orders[order];

	for ( ; rlist_empty(&list->slabs); list++) {
		if (list == cache->orders + cache->order_max) {
			slab = slab_map(cache->arena);
			if (slab == NULL)
				return NULL;
			slab_create(slab, cache->order_max,
				    cache->arena->slab_size);
			slab_poison(slab);
			slab_list_add(&cache->allocated, slab,
				      next_in_cache);
			slab_list_add(list, slab, next_in_list);
			break;
		}
	}
	slab = rlist_shift_entry(&list->slabs, struct slab, next_in_list);
	if (slab->order != order) {
		/*
		 * Do not "bill" the size of this slab to this
		 * order, to prevent double accounting of the
		 * same memory.
		 */
		list->stats.total -= slab->size;
		/* Get a slab of the right order. */
		do {
			slab = slab_split(cache, slab);
		} while (slab->order != order);
		/*
		 * Count the slab in this order. The buddy is
		 * already taken care of by slab_split.
		 */
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_set_used(cache, slab);
	slab_assert(cache, slab);
	return slab;
}